

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

Arg * __thiscall fmt::internal::ArgMap<char>::find(ArgMap<char> *this,BasicStringRef<char> *name)

{
  bool bVar1;
  pointer ppVar2;
  BasicStringRef<char> *in_RSI;
  __normal_iterator<const_std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_*,_std::vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>_>
  *in_RDI;
  const_iterator end;
  const_iterator it;
  vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
  *in_stack_ffffffffffffffa8;
  __normal_iterator<const_std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_*,_std::vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>_>
  local_20;
  BasicStringRef<char> *local_18;
  
  local_18 = in_RSI;
  local_20._M_current =
       (pair<fmt::BasicStringRef<char>,_fmt::internal::Arg> *)
       std::
       vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
       ::begin(in_stack_ffffffffffffffa8);
  std::
  vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>
  ::end(in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<const_std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_*,_std::vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>_>
                               *)in_stack_ffffffffffffffa8);
    if (!bVar1) {
      return (Arg *)0x0;
    }
    ppVar2 = __gnu_cxx::
             __normal_iterator<const_std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_*,_std::vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>_>
             ::operator->(&local_20);
    bVar1 = fmt::operator==(ppVar2->first,*local_18);
    if (bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_*,_std::vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>_>
    ::operator++(&local_20);
  }
  ppVar2 = __gnu_cxx::
           __normal_iterator<const_std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_*,_std::vector<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>,_std::allocator<std::pair<fmt::BasicStringRef<char>,_fmt::internal::Arg>_>_>_>
           ::operator->(&local_20);
  return &ppVar2->second;
}

Assistant:

const internal::Arg* find(const fmt::BasicStringRef<Char> &name) const {
    // The list is unsorted, so just return the first matching name.
    for (typename MapType::const_iterator it = map_.begin(), end = map_.end();
         it != end; ++it) {
      if (it->first == name)
        return &it->second;
    }
    return 0;
  }